

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

void mbedtls_ecdh_free(mbedtls_ecdh_context *ctx)

{
  if (ctx != (mbedtls_ecdh_context *)0x0) {
    if (ctx->var == MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0) {
      mbedtls_ecp_group_free(&(ctx->ctx).mbed_ecdh.grp);
      mbedtls_mpi_free(&(ctx->ctx).mbed_ecdh.d);
      mbedtls_ecp_point_free(&(ctx->ctx).mbed_ecdh.Q);
      mbedtls_ecp_point_free(&(ctx->ctx).mbed_ecdh.Qp);
      mbedtls_mpi_free(&(ctx->ctx).mbed_ecdh.z);
    }
    ctx->point_format = '\0';
    ctx->grp_id = MBEDTLS_ECP_DP_NONE;
    ctx->var = MBEDTLS_ECDH_VARIANT_NONE;
  }
  return;
}

Assistant:

void mbedtls_ecdh_free(mbedtls_ecdh_context *ctx)
{
    if (ctx == NULL) {
        return;
    }

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    mbedtls_ecp_point_free(&ctx->Vi);
    mbedtls_ecp_point_free(&ctx->Vf);
    mbedtls_mpi_free(&ctx->_d);
    ecdh_free_internal(ctx);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            mbedtls_everest_free(&ctx->ctx.everest_ecdh);
            break;
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            ecdh_free_internal(&ctx->ctx.mbed_ecdh);
            break;
        default:
            break;
    }

    ctx->point_format = MBEDTLS_ECP_PF_UNCOMPRESSED;
    ctx->var = MBEDTLS_ECDH_VARIANT_NONE;
    ctx->grp_id = MBEDTLS_ECP_DP_NONE;
#endif
}